

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcolumnview.cpp
# Opt level: O2

void __thiscall QColumnViewPrivate::initialize(QColumnViewPrivate *this)

{
  QPropertyAnimation *signal;
  QAbstractItemView *this_00;
  void *pvVar1;
  Data *pDVar2;
  QObject *pQVar3;
  QAbstractItemDelegate *delegate;
  long in_FS_OFFSET;
  QArrayDataPointer<char> local_50;
  void *local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QAbstractItemView **)
             &(this->super_QAbstractItemViewPrivate).super_QAbstractScrollAreaPrivate.
              super_QFramePrivate.super_QWidgetPrivate.field_0x8;
  QAbstractItemView::setTextElideMode(this_00,ElideMiddle);
  signal = &this->currentAnimation;
  local_50.d = (Data *)changeCurrentColumn;
  local_50.ptr = (char *)0x0;
  QObjectPrivate::connect<void(QAbstractAnimation::*)(),void(QColumnViewPrivate::*)()>
            ((Object *)&local_38,(offset_in_QAbstractAnimation_to_subr)signal,
             (Object *)QAbstractAnimation::finished,0,(ConnectionType)this);
  pvVar1 = (this->animationConnection).d_ptr;
  (this->animationConnection).d_ptr = local_38;
  local_38 = pvVar1;
  QMetaObject::Connection::~Connection((Connection *)&local_38);
  QPropertyAnimation::setTargetObject((QObject *)signal);
  QByteArray::QByteArray((QByteArray *)&local_50,"value",-1);
  QPropertyAnimation::setPropertyName((QByteArray *)signal);
  QArrayDataPointer<char>::~QArrayDataPointer(&local_50);
  QEasingCurve::QEasingCurve((QEasingCurve *)&local_50,InOutQuad);
  QVariantAnimation::setEasingCurve((QEasingCurve *)signal);
  QEasingCurve::~QEasingCurve((QEasingCurve *)&local_50);
  pDVar2 = (this->super_QAbstractItemViewPrivate).itemDelegate.wp.d;
  if (((pDVar2 != (Data *)0x0) && (*(int *)(pDVar2 + 4) != 0)) &&
     (pQVar3 = (this->super_QAbstractItemViewPrivate).itemDelegate.wp.value,
     pQVar3 != (QObject *)0x0)) {
    (**(code **)(*(long *)pQVar3 + 0x20))();
  }
  delegate = (QAbstractItemDelegate *)operator_new(0x10);
  QColumnViewDelegate::QColumnViewDelegate((QColumnViewDelegate *)delegate,(QObject *)this_00);
  QAbstractItemView::setItemDelegate(this_00,delegate);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QColumnViewPrivate::initialize()
{
    Q_Q(QColumnView);
    q->setTextElideMode(Qt::ElideMiddle);
#if QT_CONFIG(animation)
    animationConnection =
        QObjectPrivate::connect(&currentAnimation, &QPropertyAnimation::finished,
                                this, &QColumnViewPrivate::changeCurrentColumn);
    currentAnimation.setTargetObject(hbar);
    currentAnimation.setPropertyName("value");
    currentAnimation.setEasingCurve(QEasingCurve::InOutQuad);
#endif // animation
    delete itemDelegate;
    q->setItemDelegate(new QColumnViewDelegate(q));
}